

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

uint prvTidyApparentVersion(TidyDocImpl *doc)

{
  uint uVar1;
  Lexer *pLVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint *puVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  
  uVar7 = doc->lexer->doctype;
  if (((uVar7 == 0x1000) || (uVar7 == 0x800)) && ((doc->lexer->versions & uVar7) != 0)) {
    return uVar7;
  }
  pLVar2 = doc->lexer;
  uVar7 = pLVar2->doctype;
  uVar1 = *(uint *)((doc->config).value + 0xe);
  if ((*(int *)((doc->config).value + 100) == 0) && (pLVar2->isvoyager == no)) {
    bVar9 = false;
  }
  else {
    bVar9 = *(int *)((doc->config).value + 0x21) == 0;
  }
  bVar8 = 1 < uVar1 - 3;
  bVar10 = (uVar7 & 0x1ffc) == 0;
  uVar3 = (uint)bVar9 * 0x20000 + 0x20000;
  if (((uVar7 != 0) && (uVar3 = 0x20000, (uVar7 != 0x60000 | bVar9) == 1)) &&
     (((((bVar10 && bVar8) && (uVar1 & 0xfffffffd) == 0) & bVar9) != 1 ||
      (uVar3 = 0x40000, (pLVar2->versions & 0x60000) != 0x40000)))) {
    uVar4 = 0;
    puVar6 = &W3C_Doctypes[0].vers;
    uVar5 = 0;
    uVar7 = 0;
    do {
      if ((((bVar9 == false) || ((*puVar6 & 0x41f00) != 0)) &&
          (bVar10 && bVar8 || (*puVar6 & 0x1ffc) != 0)) &&
         (((*puVar6 & pLVar2->versions) != 0 && (((_doctypes *)(puVar6 + -1))->score <= uVar7 - 1)))
         ) {
        uVar5 = uVar4 & 0xffffffff;
        uVar7 = ((_doctypes *)(puVar6 + -1))->score;
      }
      uVar4 = uVar4 + 1;
      puVar6 = puVar6 + 10;
    } while (uVar4 != 0x13);
    if (uVar7 != 0) {
      return W3C_Doctypes[uVar5].vers;
    }
    return 0;
  }
  return uVar3;
}

Assistant:

uint TY_(ApparentVersion)( TidyDocImpl* doc )
{
    if ((doc->lexer->doctype == XH11 ||
         doc->lexer->doctype == XB10) &&
        (doc->lexer->versions & doc->lexer->doctype))
        return doc->lexer->doctype;
    else
        return TY_(HTMLVersion)(doc);
}